

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

Vec2 __thiscall nite::Vec2::operator+(Vec2 *this,float c)

{
  float fVar1;
  float fVar2;
  Vec2 VVar3;
  float *in_RSI;
  float in_XMM0_Db;
  
  fVar1 = *in_RSI;
  this->x = fVar1;
  fVar2 = in_RSI[1];
  this->x = fVar1 + c;
  this->y = c + fVar2;
  VVar3.y = in_XMM0_Db;
  VVar3.x = c + fVar2;
  return VVar3;
}

Assistant:

nite::Vec2 nite::Vec2::operator+(float c){
	Vec2 R = *this;
	R.x += c;
	R.y += c;
	return R;
}